

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O0

wchar_t slot_by_name(player *p,char *name)

{
  int iVar1;
  wchar_t local_1c;
  wchar_t i;
  char *name_local;
  player *p_local;
  
  local_1c = L'\0';
  while ((local_1c < (int)(uint)(p->body).count &&
         (iVar1 = strcmp(name,(p->body).slots[local_1c].name), iVar1 != 0))) {
    local_1c = local_1c + L'\x01';
  }
  if ((int)(uint)(p->body).count <= local_1c) {
    __assert_fail("i < p->body.count",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                  ,0x3f,"int slot_by_name(struct player *, const char *)");
  }
  return local_1c;
}

Assistant:

int slot_by_name(struct player *p, const char *name)
{
	int i;

	/* Look for the correctly named slot */
	for (i = 0; i < p->body.count; i++) {
		if (streq(name, p->body.slots[i].name)) {
			break;
		}
	}

	assert(i < p->body.count);

	/* Index for that slot */
	return i;
}